

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_parseInt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue JVar1;
  int iVar2;
  char *pcVar3;
  JSValue JVar4;
  JSValue ret;
  int flags;
  int radix;
  char *p;
  char *str;
  int in_stack_00000058;
  JSValueUnion in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  JSContext *in_stack_ffffffffffffff90;
  int32_t *in_stack_ffffffffffffff98;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion JVar5;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  JVar4.tag = in_stack_ffffffffffffff80;
  JVar4.u.float64 = in_stack_ffffffffffffff78.float64;
  pcVar3 = JS_ToCString((JSContext *)0x1b58e5,JVar4);
  if (pcVar3 == (char *)0x0) {
    local_10 = 0;
    local_8 = (char *)0x6;
  }
  else {
    val.tag._0_4_ = in_stack_ffffffffffffffb0;
    val.u = (JSValueUnion)in_stack_ffffffffffffffa8;
    val.tag._4_4_ = in_stack_ffffffffffffffb4;
    iVar2 = JS_ToInt32(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,val);
    if (iVar2 == 0) {
      if ((in_stack_ffffffffffffffb4 == 0) ||
         ((1 < in_stack_ffffffffffffffb4 && (in_stack_ffffffffffffffb4 < 0x25)))) {
        skip_spaces((char *)in_stack_ffffffffffffff90);
        JVar4 = js_atof((JSContext *)this_val.tag,(char *)this_val.u.ptr,(char **)ctx,argc,
                        in_stack_00000058);
        JVar5 = JVar4.u;
        in_stack_ffffffffffffff88 = (char *)JVar4.tag;
        local_8 = in_stack_ffffffffffffff88;
      }
      else {
        in_stack_ffffffffffffff90 = (JSContext *)0x7ff8000000000000;
        JVar5.float64 = NAN;
        local_8 = (char *)0x7;
      }
      JS_FreeCString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_10 = JVar5.int32;
      uStack_c = JVar5._4_4_;
    }
    else {
      JS_FreeCString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_10 = 0;
      local_8 = (char *)0x6;
    }
  }
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8;
  return JVar1;
}

Assistant:

static JSValue js_parseInt(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *str, *p;
    int radix, flags;
    JSValue ret;

    str = JS_ToCString(ctx, argv[0]);
    if (!str)
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &radix, argv[1])) {
        JS_FreeCString(ctx, str);
        return JS_EXCEPTION;
    }
    if (radix != 0 && (radix < 2 || radix > 36)) {
        ret = JS_NAN;
    } else {
        p = str;
        p += skip_spaces(p);
        flags = ATOD_INT_ONLY | ATOD_ACCEPT_PREFIX_AFTER_SIGN;
        ret = js_atof(ctx, p, NULL, radix, flags);
    }
    JS_FreeCString(ctx, str);
    return ret;
}